

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTypePtr
xmlSchemaParseComplexType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  int *flags;
  byte *pbVar1;
  uint uVar2;
  _xmlAttr *p_Var3;
  bool bVar4;
  xmlSchemaTypeType xVar5;
  int iVar6;
  int iVar7;
  xmlAttrPtr pxVar8;
  xmlSchemaTypePtr pxVar9;
  xmlSchemaAnnotPtr pxVar10;
  xmlSchemaWildcardPtr pxVar11;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar12;
  xmlNs *pxVar13;
  xmlNodePtr extraout_RDX;
  xmlNodePtr ownerComp;
  xmlChar *name_00;
  xmlNodePtr node_00;
  xmlNodePtr node_01;
  xmlNodePtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr pxVar14;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlChar **in_R8;
  char *type;
  char *in_R9;
  _xmlNode **pp_Var15;
  _xmlNode *p_Var16;
  xmlSchemaTypePtr pxVar17;
  _xmlAttr **pp_Var18;
  _xmlNode *node_02;
  ulong in_stack_ffffffffffffff78;
  undefined4 uVar19;
  char *content;
  undefined8 in_stack_ffffffffffffff80;
  xmlNodePtr child;
  int local_64;
  xmlSchemaTypePtr local_60;
  int local_54;
  xmlSchemaTypePtr local_50;
  xmlChar *local_48;
  xmlSchemaTypePtr local_40;
  xmlChar *name;
  
  uVar19 = (undefined4)(in_stack_ffffffffffffff78 >> 0x20);
  pxVar12 = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  child = (xmlNodePtr)0x0;
  name = (xmlChar *)0x0;
  pxVar17 = ctxt->ctxtType;
  if (topLevel == 0) {
    content = (char *)(in_stack_ffffffffffffff78 & 0xffffffff00000000);
    pxVar9 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar9 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    name = pxVar9->name;
    pxVar9->node = node;
    pxVar9->type = XML_SCHEMA_TYPE_COMPLEX;
  }
  else {
    pxVar8 = xmlSchemaGetPropNode(node,"name");
    if (pxVar8 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1c0014,pxVar12,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar6 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar8,(xmlAttrPtr)pxVar9,(xmlSchemaTypePtr)&name
                       ,in_R8);
    if (iVar6 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    content = (char *)CONCAT44(uVar19,1);
    pxVar9 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,name,ctxt->targetNamespace,node,1)
    ;
    if (pxVar9 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar9->node = node;
    pxVar9->type = XML_SCHEMA_TYPE_COMPLEX;
    *(byte *)&pxVar9->flags = (byte)pxVar9->flags | 8;
  }
  pxVar8 = (xmlAttrPtr)ctxt->targetNamespace;
  pxVar9->targetNamespace = (xmlChar *)pxVar8;
  flags = &pxVar9->flags;
  local_60 = (xmlSchemaTypePtr)0x0;
  local_54 = 0;
  pp_Var15 = (_xmlNode **)&node->properties;
  local_64 = topLevel;
  local_50 = pxVar17;
  local_40 = pxVar9;
  while (pxVar17 = local_40, pxVar12 = *pp_Var15, pxVar12 != (xmlNodePtr)0x0) {
    if (pxVar12->ns == (xmlNs *)0x0) {
      iVar6 = xmlStrEqual(pxVar12->name,"id");
      if (iVar6 == 0) {
        iVar6 = xmlStrEqual(pxVar12->name,(xmlChar *)"mixed");
        if (iVar6 == 0) {
          ownerComp = node_00;
          if (local_64 == 0) goto LAB_0018f6f7;
          iVar6 = xmlStrEqual(pxVar12->name,"name");
          if (iVar6 == 0) {
            iVar6 = xmlStrEqual(pxVar12->name,"abstract");
            if (iVar6 == 0) {
              iVar6 = xmlStrEqual(pxVar12->name,(xmlChar *)"final");
              if (iVar6 == 0) {
                iVar6 = xmlStrEqual(pxVar12->name,(xmlChar *)"block");
                ownerComp = extraout_RDX_00;
                if (iVar6 == 0) goto LAB_0018f6f7;
                local_48 = xmlSchemaGetNodeContent(ctxt,pxVar12);
                content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                pxVar8 = (xmlAttrPtr)0x80000;
                iVar6 = xmlSchemaPValAttrBlockFinal
                                  (local_48,flags,0x40000,0x80000,-1,-1,-1,
                                   (int)in_stack_ffffffffffffff80);
                if (iVar6 != 0) {
                  type = "(#all | List of (extension | restriction)) ";
                  goto LAB_0018f865;
                }
                local_54 = 1;
              }
              else {
                local_48 = xmlSchemaGetNodeContent(ctxt,pxVar12);
                content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                pxVar8 = (xmlAttrPtr)0x400;
                iVar6 = xmlSchemaPValAttrBlockFinal
                                  (local_48,flags,0x200,0x400,-1,-1,-1,
                                   (int)in_stack_ffffffffffffff80);
                if (iVar6 == 0) {
                  local_60 = (xmlSchemaTypePtr)0x1;
                }
                else {
                  type = "(#all | List of (extension | restriction))";
LAB_0018f865:
                  in_stack_ffffffffffffff80 = 0;
                  content = (char *)0x0;
                  pxVar8 = (xmlAttrPtr)0x0;
                  xmlSchemaPSimpleTypeErr
                            (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                             (xmlNodePtr)0x0,(xmlSchemaTypePtr)type,(char *)local_48,(xmlChar *)0x0,
                             (char *)0x0,(xmlChar *)schema,(xmlChar *)child);
                }
              }
            }
            else {
              iVar6 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)pxVar12,node_01);
              if (iVar6 != 0) {
                pbVar1 = (byte *)((long)&pxVar9->flags + 2);
                *pbVar1 = *pbVar1 | 0x10;
              }
            }
          }
        }
        else {
          iVar6 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)pxVar12,node_00);
          if (iVar6 != 0) {
            *(byte *)flags = (byte)*flags | 1;
          }
        }
      }
      else {
        xmlSchemaPValAttrID(ctxt,node,name_00);
      }
    }
    else {
      iVar6 = xmlStrEqual(pxVar12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      ownerComp = extraout_RDX;
      if (iVar6 != 0) {
LAB_0018f6f7:
        xmlSchemaPIllegalAttrErr
                  (ctxt,(xmlParserErrors)pxVar12,(xmlSchemaBasicItemPtr)ownerComp,pxVar8);
      }
    }
    pp_Var15 = &pxVar12->next;
  }
  if (local_54 == 0) {
    uVar2 = schema->flags;
    if ((char)uVar2 < '\0') {
      pbVar1 = (byte *)((long)&pxVar9->flags + 2);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((uVar2 & 0x40) != 0) {
      pbVar1 = (byte *)((long)&pxVar9->flags + 2);
      *pbVar1 = *pbVar1 | 4;
    }
  }
  if ((int)local_60 == 0) {
    uVar2 = schema->flags;
    if ((uVar2 & 8) != 0) {
      pbVar1 = (byte *)((long)&pxVar9->flags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((uVar2 & 4) != 0) {
      pbVar1 = (byte *)((long)&pxVar9->flags + 1);
      *pbVar1 = *pbVar1 | 2;
    }
  }
  p_Var16 = node->children;
  child = p_Var16;
  if (p_Var16 == (xmlNodePtr)0x0) {
    ctxt->ctxtType = local_40;
LAB_0018fa28:
    bVar4 = true;
    p_Var16 = (xmlNodePtr)0x0;
LAB_0018fbb4:
    pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
    iVar6 = local_64;
    pxVar17->baseType = pxVar9;
    *(byte *)&pxVar17->flags = (byte)pxVar17->flags | 4;
    if ((!bVar4) && (p_Var16->ns != (xmlNs *)0x0)) {
      iVar7 = xmlStrEqual(p_Var16->name,"all");
      pxVar13 = p_Var16->ns;
      if (iVar7 == 0) {
LAB_0018fc14:
        if (pxVar13 != (xmlNs *)0x0) {
          iVar7 = xmlStrEqual(p_Var16->name,(xmlChar *)"choice");
          pxVar13 = p_Var16->ns;
          if (iVar7 != 0) {
            iVar7 = xmlStrEqual(pxVar13->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            if (iVar7 != 0) {
              xVar5 = XML_SCHEMA_TYPE_CHOICE;
              goto LAB_0018fe0f;
            }
            pxVar13 = p_Var16->ns;
          }
          if (pxVar13 != (xmlNs *)0x0) {
            iVar7 = xmlStrEqual(p_Var16->name,(xmlChar *)"sequence");
            pxVar13 = p_Var16->ns;
            if (iVar7 != 0) {
              iVar7 = xmlStrEqual(pxVar13->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              if (iVar7 != 0) {
                xVar5 = XML_SCHEMA_TYPE_SEQUENCE;
                goto LAB_0018fe0f;
              }
              pxVar13 = p_Var16->ns;
            }
            if (((pxVar13 != (xmlNs *)0x0) &&
                (iVar7 = xmlStrEqual(p_Var16->name,"group"), iVar7 != 0)) &&
               (iVar7 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar7 != 0)) {
              pxVar9 = (xmlSchemaTypePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,p_Var16);
              goto LAB_0018fe24;
            }
          }
        }
      }
      else {
        iVar7 = xmlStrEqual(pxVar13->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar7 == 0) {
          pxVar13 = p_Var16->ns;
          goto LAB_0018fc14;
        }
        xVar5 = XML_SCHEMA_TYPE_ALL;
LAB_0018fe0f:
        pxVar9 = (xmlSchemaTypePtr)xmlSchemaParseModelGroup(ctxt,schema,p_Var16,xVar5,1);
LAB_0018fe24:
        pxVar17->subtypes = pxVar9;
        child = p_Var16->next;
      }
    }
    bVar4 = false;
    local_64 = iVar6;
    iVar6 = xmlSchemaParseLocalAttributes
                      (ctxt,schema,&child,(xmlSchemaItemListPtr *)&pxVar17->attrUses,0xc,(int *)0x0)
    ;
    pxVar17 = local_50;
    p_Var16 = child;
    if (iVar6 == -1) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (child == (xmlNodePtr)0x0) goto LAB_0018ff89;
    bVar4 = false;
    if (((child->ns != (xmlNs *)0x0) &&
        (iVar6 = xmlStrEqual(child->name,(xmlChar *)"anyAttribute"), iVar6 != 0)) &&
       (iVar6 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 != 0)) {
      pxVar11 = xmlSchemaParseAnyAttribute(ctxt,schema,p_Var16);
      local_40->attributeWildcard = pxVar11;
      p_Var16 = p_Var16->next;
      bVar4 = false;
      goto LAB_0018ff67;
    }
  }
  else {
    if (((p_Var16->ns == (xmlNs *)0x0) ||
        (iVar6 = xmlStrEqual(p_Var16->name,(xmlChar *)"annotation"), iVar6 == 0)) ||
       (iVar6 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 == 0)) {
      ctxt->ctxtType = pxVar17;
    }
    else {
      pxVar10 = xmlSchemaParseAnnotation(ctxt,p_Var16,1);
      pxVar17->annot = pxVar10;
      p_Var16 = p_Var16->next;
      ctxt->ctxtType = pxVar17;
      child = p_Var16;
      if (p_Var16 == (_xmlNode *)0x0) goto LAB_0018fa28;
    }
    if (p_Var16->ns == (xmlNs *)0x0) {
LAB_0018fbb2:
      bVar4 = false;
      goto LAB_0018fbb4;
    }
    iVar6 = xmlStrEqual(p_Var16->name,(xmlChar *)"simpleContent");
    pxVar8 = (xmlAttrPtr)p_Var16->ns;
    if (iVar6 == 0) {
LAB_0018faf3:
      if (((pxVar8 == (xmlAttrPtr)0x0) ||
          (iVar6 = xmlStrEqual(p_Var16->name,(xmlChar *)"complexContent"), iVar6 == 0)) ||
         (iVar6 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) goto LAB_0018fbb2;
      pxVar17->contentType = XML_SCHEMA_CONTENT_EMPTY;
      local_60 = ctxt->ctxtType;
      pp_Var18 = &p_Var16->properties;
      pxVar14 = extraout_RDX_05;
      while (p_Var3 = *pp_Var18, p_Var3 != (_xmlAttr *)0x0) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar6 = xmlStrEqual(p_Var3->name,"id");
          pxVar14 = extraout_RDX_08;
          if ((iVar6 == 0) &&
             (iVar6 = xmlStrEqual(p_Var3->name,(xmlChar *)"mixed"), pxVar14 = extraout_RDX_09,
             iVar6 == 0)) goto LAB_0018fb7b;
        }
        else {
          iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar14 = extraout_RDX_06;
          if (iVar6 != 0) {
LAB_0018fb7b:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar14,pxVar8);
            pxVar14 = extraout_RDX_07;
          }
        }
        pp_Var18 = &p_Var3->next;
      }
      xmlSchemaPValAttrID(ctxt,p_Var16,(xmlChar *)pxVar14);
      iVar6 = xmlGetBooleanProp(ctxt,p_Var16,"mixed",(int)pxVar8);
      pxVar17 = local_60;
      if ((iVar6 != 0) && ((local_60->flags & 1U) == 0)) {
        local_60->flags = local_60->flags | 1;
      }
      node_02 = p_Var16->children;
      if (node_02 != (xmlNodePtr)0x0) {
        if (((node_02->ns != (xmlNs *)0x0) &&
            (iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
           (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 != 0)) {
          pxVar10 = xmlSchemaParseAnnotation(ctxt,node_02,1);
          xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar17,pxVar10);
          node_02 = node_02->next;
          if (node_02 == (xmlNodePtr)0x0) goto LAB_0018fd4b;
        }
        bVar4 = false;
        if (node_02->ns != (xmlNs *)0x0) {
          iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"restriction");
          if ((iVar6 != 0) &&
             (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 != 0)) {
            xVar5 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
            goto LAB_0018fd35;
          }
          if (((node_02->ns != (xmlNs *)0x0) &&
              (iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), iVar6 != 0)) &&
             (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 != 0)) {
            xVar5 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
            goto LAB_0018ff19;
          }
        }
        goto LAB_0018ff37;
      }
LAB_0018fd4b:
      bVar4 = false;
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)p_Var16,(xmlNodePtr)0x0,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)p_Var16,(xmlNodePtr)0x0,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
    }
    else {
      iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar6 == 0) {
        pxVar8 = (xmlAttrPtr)p_Var16->ns;
        goto LAB_0018faf3;
      }
      if ((*flags & 1U) != 0) {
        *flags = *flags & 0xfffffffe;
      }
      local_60 = ctxt->ctxtType;
      local_60->contentType = XML_SCHEMA_CONTENT_SIMPLE;
      pp_Var18 = &p_Var16->properties;
      pxVar14 = extraout_RDX_01;
      while (p_Var3 = *pp_Var18, p_Var3 != (_xmlAttr *)0x0) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar6 = xmlStrEqual(p_Var3->name,"id");
          pxVar14 = extraout_RDX_04;
          if (iVar6 == 0) goto LAB_0018f9fe;
        }
        else {
          iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar14 = extraout_RDX_02;
          if (iVar6 != 0) {
LAB_0018f9fe:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar14,pxVar8);
            pxVar14 = extraout_RDX_03;
          }
        }
        pp_Var18 = &p_Var3->next;
      }
      xmlSchemaPValAttrID(ctxt,p_Var16,(xmlChar *)pxVar14);
      node_02 = p_Var16->children;
      if (node_02 == (xmlNodePtr)0x0) goto LAB_0018fd4b;
      if (((node_02->ns != (xmlNs *)0x0) &&
          (iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
         (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 != 0)) {
        pxVar10 = xmlSchemaParseAnnotation(ctxt,node_02,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)local_60,pxVar10);
        node_02 = node_02->next;
        if (node_02 == (xmlNodePtr)0x0) goto LAB_0018fd4b;
      }
      bVar4 = false;
      if (node_02->ns != (xmlNs *)0x0) {
        iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"restriction");
        if ((iVar6 == 0) ||
           (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if ((node_02->ns == (xmlNs *)0x0) ||
             ((iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), bVar4 = false, iVar6 == 0
              || (iVar6 = xmlStrEqual(node_02->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))))
          goto LAB_0018ff37;
          xVar5 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_0018ff19:
          xmlSchemaParseExtension(ctxt,schema,node_02,xVar5);
        }
        else {
          xVar5 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_0018fd35:
          xmlSchemaParseRestriction(ctxt,schema,node_02,xVar5);
        }
        node_02 = node_02->next;
        bVar4 = true;
        if (node_02 == (_xmlNode *)0x0) goto LAB_0018ff59;
      }
LAB_0018ff37:
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)p_Var16,node_02,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
      p_Var16 = child;
    }
LAB_0018ff59:
    p_Var16 = p_Var16->next;
    pxVar17 = local_50;
LAB_0018ff67:
    child = p_Var16;
    if (p_Var16 == (_xmlNode *)0x0) goto LAB_0018ff89;
  }
  xmlSchemaPContentErr
            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,p_Var16,
             (xmlNodePtr)0x0,
             "(annotation?, (simpleContent | complexContent | ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?))))"
             ,content);
LAB_0018ff89:
  if (((local_64 != 0) && (!bVar4)) && (ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                        "This is a redefinition, thus the <complexType> must have a <restriction> or <extension> grand-child"
                        ,(xmlChar *)0x0);
  }
  ctxt->ctxtType = pxVar17;
  return local_40;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseComplexType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                          xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, ctxtType;
    xmlNodePtr child = NULL;
    const xmlChar *name = NULL;
    xmlAttrPtr attr;
    const xmlChar *attrValue;
#ifdef ENABLE_NAMED_LOCALS
    char buf[40];
#endif
    int final = 0, block = 0, hasRestrictionOrExtension = 0;


    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ctxtType = ctxt->ctxtType;

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING, NULL, node, "name", NULL);
	    return (NULL);
	} else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	    return (NULL);
	}
    }

    if (topLevel == 0) {
	/*
	* Parse as local complex type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#CT%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	name = type->name;
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	/*
	* TODO: We need the target namespace.
	*/
    } else {
	/*
	* Parse as global complex type definition.
	*/
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    name, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
    }
    type->targetNamespace = ctxt->targetNamespace;
    /*
    * Handle attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if (xmlStrEqual(attr->name, BAD_CAST "id")) {
		/*
		* Attribute "id".
		*/
		xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
	    } else if (xmlStrEqual(attr->name, BAD_CAST "mixed")) {
		/*
		* Attribute "mixed".
		*/
		if (xmlSchemaPGetBoolNodeValue(ctxt,
			NULL, (xmlNodePtr) attr))
		    type->flags |= XML_SCHEMAS_TYPE_MIXED;
	    } else if (topLevel) {
		/*
		* Attributes of global complex type definitions.
		*/
		if (xmlStrEqual(attr->name, BAD_CAST "name")) {
		    /* Pass. */
		} else if (xmlStrEqual(attr->name, BAD_CAST "abstract")) {
		    /*
		    * Attribute "abstract".
		    */
		    if (xmlSchemaPGetBoolNodeValue(ctxt,
			    NULL, (xmlNodePtr) attr))
			type->flags |= XML_SCHEMAS_TYPE_ABSTRACT;
		} else if (xmlStrEqual(attr->name, BAD_CAST "final")) {
		    /*
		    * Attribute "final".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue,
			&(type->flags),
			-1,
			XML_SCHEMAS_TYPE_FINAL_EXTENSION,
			XML_SCHEMAS_TYPE_FINAL_RESTRICTION,
			-1, -1, -1) != 0)
		    {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction))",
			    attrValue, NULL, NULL, NULL);
		    } else
			final = 1;
		} else if (xmlStrEqual(attr->name, BAD_CAST "block")) {
		    /*
		    * Attribute "block".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
			-1,
			XML_SCHEMAS_TYPE_BLOCK_EXTENSION,
			XML_SCHEMAS_TYPE_BLOCK_RESTRICTION,
			-1, -1, -1) != 0) {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction)) ",
			    attrValue, NULL, NULL, NULL);
		    } else
			block = 1;
		} else {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    if (! block) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_EXTENSION;
    }
    if (! final) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_EXTENSION;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    ctxt->ctxtType = type;
    if (IS_SCHEMA(child, "simpleContent")) {
	/*
	* <complexType><simpleContent>...
	* 3.4.3 : 2.2
	* Specifying mixed='true' when the <simpleContent>
	* alternative is chosen has no effect
	*/
	if (type->flags & XML_SCHEMAS_TYPE_MIXED)
	    type->flags ^= XML_SCHEMAS_TYPE_MIXED;
        xmlSchemaParseSimpleContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else if (IS_SCHEMA(child, "complexContent")) {
	/*
	* <complexType><complexContent>...
	*/
	type->contentType = XML_SCHEMA_CONTENT_EMPTY;
        xmlSchemaParseComplexContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else {
	/*
	* E.g <complexType><sequence>... or <complexType><attribute>... etc.
	*
	* SPEC
	* "...the third alternative (neither <simpleContent> nor
	* <complexContent>) is chosen. This case is understood as shorthand
	* for complex content restricting the `ur-type definition`, and the
	* details of the mappings should be modified as necessary.
	*/
	type->baseType = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
	type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_RESTRICTION;
	/*
	* Parse model groups.
	*/
        if (IS_SCHEMA(child, "all")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_ALL, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "choice")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "sequence")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "group")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
            child = child->next;
        }
	/*
	* Parse attribute decls/refs.
	*/
        if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_RESTRICTION, NULL) == -1)
	    return(NULL);
	/*
	* Parse attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    type->attributeWildcard = xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?, (simpleContent | complexContent | "
	    "((group | all | choice | sequence)?, ((attribute | "
	    "attributeGroup)*, anyAttribute?))))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    */
    if (topLevel && ctxt->isRedefine && (! hasRestrictionOrExtension)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<complexType> must have a <restriction> or <extension> "
	    "grand-child", NULL);
    }
    ctxt->ctxtType = ctxtType;
    return (type);
}